

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramCopyAndAnalyze
               (VP8LHistogramSet *orig_histo,VP8LHistogramSet *image_histo,int *num_used,
               uint16_t *histogram_symbols)

{
  long lVar1;
  short sVar2;
  long in_RCX;
  int *in_RDX;
  VP8LHistogram *in_RSI;
  VP8LHistogramSet *in_RDI;
  VP8LHistogram *histo;
  VP8LHistogram **histograms;
  VP8LHistogram **orig_histograms;
  int num_used_orig;
  int cluster_id;
  int i;
  VP8LHistogram *dst;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int local_24;
  
  iVar3 = *in_RDX;
  dst = (VP8LHistogram *)in_RDI->histograms;
  sVar2 = 0;
  for (local_24 = 0; local_24 < in_RDI->max_size; local_24 = local_24 + 1) {
    lVar1 = *(long *)(dst->red_ + (long)local_24 * 2 + -2);
    UpdateHistogramCost(in_RSI);
    if ((((*(char *)(lVar1 + 0xcd0) == '\0') && (*(char *)(lVar1 + 0xcd1) == '\0')) &&
        (*(char *)(lVar1 + 0xcd2) == '\0')) &&
       ((*(char *)(lVar1 + 0xcd3) == '\0' && (*(char *)(lVar1 + 0xcd4) == '\0')))) {
      HistogramSetRemoveHistogram((VP8LHistogramSet *)in_RSI,local_24,in_RDX);
      HistogramSetRemoveHistogram(in_RDI,local_24,(int *)&stack0xffffffffffffffd4);
      *(undefined2 *)(in_RCX + (long)local_24 * 2) = 0xffff;
    }
    else {
      HistogramCopy((VP8LHistogram *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),dst);
      *(short *)(in_RCX + (long)local_24 * 2) = sVar2;
      sVar2 = sVar2 + 1;
    }
  }
  return;
}

Assistant:

static void HistogramCopyAndAnalyze(VP8LHistogramSet* const orig_histo,
                                    VP8LHistogramSet* const image_histo,
                                    int* const num_used,
                                    uint16_t* const histogram_symbols) {
  int i, cluster_id;
  int num_used_orig = *num_used;
  VP8LHistogram** const orig_histograms = orig_histo->histograms;
  VP8LHistogram** const histograms = image_histo->histograms;
  assert(image_histo->max_size == orig_histo->max_size);
  for (cluster_id = 0, i = 0; i < orig_histo->max_size; ++i) {
    VP8LHistogram* const histo = orig_histograms[i];
    UpdateHistogramCost(histo);

    // Skip the histogram if it is completely empty, which can happen for tiles
    // with no information (when they are skipped because of LZ77).
    if (!histo->is_used_[0] && !histo->is_used_[1] && !histo->is_used_[2]
        && !histo->is_used_[3] && !histo->is_used_[4]) {
      // The first histogram is always used. If an histogram is empty, we set
      // its id to be the same as the previous one: this will improve
      // compressibility for later LZ77.
      assert(i > 0);
      HistogramSetRemoveHistogram(image_histo, i, num_used);
      HistogramSetRemoveHistogram(orig_histo, i, &num_used_orig);
      histogram_symbols[i] = kInvalidHistogramSymbol;
    } else {
      // Copy histograms from orig_histo[] to image_histo[].
      HistogramCopy(histo, histograms[i]);
      histogram_symbols[i] = cluster_id++;
      assert(cluster_id <= image_histo->max_size);
    }
  }
}